

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log_level.cpp
# Opt level: O0

void log_level_test(void)

{
  bool bVar1;
  log_level lVar2;
  Logger *pLVar3;
  
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] \n------------------set log level as debug----------------\n","info",
           "log_level_test",6);
  }
  Logger::set_log_level(LOG_LEVEL_DEBUG);
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",8);
  }
  lVar2 = Logger::get_log_level();
  if (-1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",8,LOG_LEVEL_ERROR,"*****************log error\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",9);
  }
  lVar2 = Logger::get_log_level();
  if (0 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",9,LOG_LEVEL_WARN,"*****************log warn\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",10);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",10,LOG_LEVEL_INFO,"*****************log info\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0xb);
  }
  lVar2 = Logger::get_log_level();
  if (2 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0xb,LOG_LEVEL_DEBUG,"*****************log debug\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] \n------------------set log level as info----------------\n","info",
           "log_level_test",0xd);
  }
  Logger::set_log_level(LOG_LEVEL_INFO);
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0xf);
  }
  lVar2 = Logger::get_log_level();
  if (-1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0xf,LOG_LEVEL_ERROR,"*****************log error\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x10);
  }
  lVar2 = Logger::get_log_level();
  if (0 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x10,LOG_LEVEL_WARN,"*****************log warn\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x11);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x11,LOG_LEVEL_INFO,"*****************log info\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x12);
  }
  lVar2 = Logger::get_log_level();
  if (2 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x12,LOG_LEVEL_DEBUG,"*****************log debug\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] \n------------------set log level as warn----------------\n","info",
           "log_level_test",0x14);
  }
  Logger::set_log_level(LOG_LEVEL_WARN);
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x16);
  }
  lVar2 = Logger::get_log_level();
  if (-1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x16,LOG_LEVEL_ERROR,"*****************log error\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x17);
  }
  lVar2 = Logger::get_log_level();
  if (0 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x17,LOG_LEVEL_WARN,"*****************log warn\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x18);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x18,LOG_LEVEL_INFO,"*****************log info\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x19);
  }
  lVar2 = Logger::get_log_level();
  if (2 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x19,LOG_LEVEL_DEBUG,"*****************log debug\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] \n------------------set log level as error----------------\n","info",
           "log_level_test",0x1b);
  }
  Logger::set_log_level(LOG_LEVEL_ERROR);
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x1d);
  }
  lVar2 = Logger::get_log_level();
  if (-1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x1d,LOG_LEVEL_ERROR,"*****************log error\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x1e);
  }
  lVar2 = Logger::get_log_level();
  if (0 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x1e,LOG_LEVEL_WARN,"*****************log warn\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x1f);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x1f,LOG_LEVEL_INFO,"*****************log info\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","log_level_test",0x20);
  }
  lVar2 = Logger::get_log_level();
  if (2 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/log/tests/test_log_level.cpp"
                      ,"log_level_test",0x20,LOG_LEVEL_DEBUG,"*****************log debug\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  return;
}

Assistant:

void log_level_test()
{
    PR_INFO("\n------------------set log level as debug----------------\n");
    Logger::set_log_level(Logger::LOG_LEVEL_DEBUG);
    LOG_ERROR("*****************log error\n");
    LOG_WARN("*****************log warn\n");
    LOG_INFO("*****************log info\n");
    LOG_DEBUG("*****************log debug\n");

    PR_INFO("\n------------------set log level as info----------------\n");
    Logger::set_log_level(Logger::LOG_LEVEL_INFO);
    LOG_ERROR("*****************log error\n");
    LOG_WARN("*****************log warn\n");
    LOG_INFO("*****************log info\n");
    LOG_DEBUG("*****************log debug\n");

    PR_INFO("\n------------------set log level as warn----------------\n");
    Logger::set_log_level(Logger::LOG_LEVEL_WARN);
    LOG_ERROR("*****************log error\n");
    LOG_WARN("*****************log warn\n");
    LOG_INFO("*****************log info\n");
    LOG_DEBUG("*****************log debug\n");

    PR_INFO("\n------------------set log level as error----------------\n");
    Logger::set_log_level(Logger::LOG_LEVEL_ERROR);
    LOG_ERROR("*****************log error\n");
    LOG_WARN("*****************log warn\n");
    LOG_INFO("*****************log info\n");
    LOG_DEBUG("*****************log debug\n");
}